

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::RunContext::reportExpr
          (RunContext *this,AssertionInfo *info,OfType resultType,ITransientExpression *expr,
          bool negated)

{
  OfType *this_00;
  char *pcVar1;
  size_type sVar2;
  char *pcVar3;
  size_t sVar4;
  size_type sVar5;
  undefined1 local_128 [8];
  AssertionResult assertionResult;
  undefined1 local_88 [8];
  AssertionResultData data;
  bool negated_local;
  ITransientExpression *expr_local;
  OfType resultType_local;
  AssertionInfo *info_local;
  RunContext *this_local;
  
  (this->m_lastAssertionInfo).resultDisposition = info->resultDisposition;
  pcVar1 = (info->macroName).m_start;
  sVar2 = (info->macroName).m_size;
  pcVar3 = (info->lineInfo).file;
  sVar4 = (info->lineInfo).line;
  sVar5 = (info->capturedExpression).m_size;
  (this->m_lastAssertionInfo).capturedExpression.m_start = (info->capturedExpression).m_start;
  (this->m_lastAssertionInfo).capturedExpression.m_size = sVar5;
  (this->m_lastAssertionInfo).lineInfo.file = pcVar3;
  (this->m_lastAssertionInfo).lineInfo.line = sVar4;
  (this->m_lastAssertionInfo).macroName.m_start = pcVar1;
  (this->m_lastAssertionInfo).macroName.m_size = sVar2;
  this_00 = &assertionResult.m_resultData.resultType;
  data._87_1_ = negated;
  LazyExpression::LazyExpression((LazyExpression *)this_00,negated);
  AssertionResultData::AssertionResultData
            ((AssertionResultData *)local_88,resultType,(LazyExpression *)this_00);
  AssertionResult::AssertionResult
            ((AssertionResult *)local_128,info,(AssertionResultData *)local_88);
  assertionResult.m_resultData.reconstructedExpression.field_2._8_8_ = expr;
  assertionEnded(this,(AssertionResult *)local_128);
  AssertionResult::~AssertionResult((AssertionResult *)local_128);
  AssertionResultData::~AssertionResultData((AssertionResultData *)local_88);
  return;
}

Assistant:

void RunContext::reportExpr(
            AssertionInfo const &info,
            ResultWas::OfType resultType,
            ITransientExpression const *expr,
            bool negated ) {

        m_lastAssertionInfo = info;
        AssertionResultData data( resultType, LazyExpression( negated ) );

        AssertionResult assertionResult{ info, data };
        assertionResult.m_resultData.lazyExpression.m_transientExpression = expr;

        assertionEnded( assertionResult );
    }